

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

void __thiscall PoolResource<128UL,_8UL>::~PoolResource(PoolResource<128UL,_8UL> *this)

{
  long lVar1;
  bool bVar2;
  reference ppbVar3;
  list<std::byte_*,_std::allocator<std::byte_*>_> *in_RDI;
  long in_FS_OFFSET;
  byte *chunk;
  list<std::byte_*,_std::allocator<std::byte_*>_> *__range2;
  iterator __end2;
  iterator __begin2;
  list<std::byte_*,_std::allocator<std::byte_*>_> *in_stack_ffffffffffffffd0;
  _List_node_base **__x;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __x = &(in_RDI->super__List_base<std::byte_*,_std::allocator<std::byte_*>_>)._M_impl._M_node.
         super__List_node_base._M_prev;
  std::__cxx11::list<std::byte_*,_std::allocator<std::byte_*>_>::begin(in_stack_ffffffffffffffd0);
  std::__cxx11::list<std::byte_*,_std::allocator<std::byte_*>_>::end(in_stack_ffffffffffffffd0);
  while( true ) {
    bVar2 = std::operator==((_Self *)__x,(_Self *)in_stack_ffffffffffffffd0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppbVar3 = std::_List_iterator<std::byte_*>::operator*((_List_iterator<std::byte_*> *)in_RDI);
    in_stack_ffffffffffffffd0 = (list<std::byte_*,_std::allocator<std::byte_*>_> *)*ppbVar3;
    std::destroy<std::byte*>((byte *)in_RDI,(byte *)0x90841e);
    operator_delete(in_stack_ffffffffffffffd0,8);
    std::_List_iterator<std::byte_*>::operator++((_List_iterator<std::byte_*> *)in_RDI);
  }
  std::__cxx11::list<std::byte_*,_std::allocator<std::byte_*>_>::~list(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~PoolResource()
    {
        for (std::byte* chunk : m_allocated_chunks) {
            std::destroy(chunk, chunk + m_chunk_size_bytes);
            ::operator delete ((void*)chunk, std::align_val_t{ELEM_ALIGN_BYTES});
        }
    }